

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v6::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  char *p;
  type __n;
  wchar_t *p_00;
  ulong uVar1;
  char *pcVar2;
  char buf [7];
  anon_class_8_1_8991fb9c transcode;
  wchar_t local_40;
  undefined3 uStack_3c;
  anon_class_8_1_8991fb9c local_38;
  
  uVar1 = s.size_;
  pcVar2 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_001f1c50;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  p = pcVar2;
  local_38.this = this;
  if (3 < uVar1) {
    for (; p < pcVar2 + (uVar1 - 3);
        p = utf8_to_utf16::anon_class_8_1_8991fb9c::operator()(&local_38,p)) {
    }
  }
  pcVar2 = pcVar2 + (uVar1 - (long)p);
  if (pcVar2 != (char *)0x0) {
    uStack_3c = 0;
    local_40 = L'\0';
    __n = to_unsigned<long>((long)pcVar2);
    memcpy(&local_40,p,__n);
    p_00 = &local_40;
    do {
      p_00 = (wchar_t *)utf8_to_utf16::anon_class_8_1_8991fb9c::operator()(&local_38,(char *)p_00);
    } while ((long)p_00 - (long)&local_40 < (long)pcVar2);
  }
  local_40 = L'\0';
  buffer<wchar_t>::push_back((buffer<wchar_t> *)this,&local_40);
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}